

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo-server.c
# Opt level: O1

int run_helper_tcp6_echo_server(void)

{
  int iVar1;
  int64_t eval_a;
  sockaddr_in6 addr6;
  uv_fs_t uStack_200;
  sockaddr_in6 local_24;
  
  loop = uv_default_loop();
  iVar1 = uv_ip6_addr("::1",0x23a3,&local_24);
  if (iVar1 != 0) {
    run_helper_tcp6_echo_server_cold_1();
    loop = uv_default_loop();
    uv_fs_unlink((uv_loop_t *)0x0,&uStack_200,"/tmp/uv-test-sock",(uv_fs_cb)0x0);
    uv_fs_req_cleanup(&uStack_200);
    server = (uv_handle_t *)&pipeServer;
    serverType = PIPE;
    iVar1 = uv_pipe_init(loop,&pipeServer,0);
    if (iVar1 == 0) {
      iVar1 = uv_pipe_bind(&pipeServer,"/tmp/uv-test-sock");
      if (iVar1 == 0) {
        iVar1 = uv_listen((uv_stream_t *)&pipeServer,0x1000,on_connection);
        if (iVar1 == 0) {
          notify_parent_process();
          uv_run(loop,UV_RUN_DEFAULT);
          return 0;
        }
        run_helper_pipe_echo_server_cold_3();
      }
      else {
        run_helper_pipe_echo_server_cold_2();
      }
    }
    else {
      run_helper_pipe_echo_server_cold_1();
    }
    return 1;
  }
  server = (uv_handle_t *)&tcpServer;
  serverType = TCP;
  iVar1 = uv_tcp_init(loop,&tcpServer);
  if (iVar1 == 0) {
    iVar1 = uv_tcp_bind(&tcpServer,(sockaddr *)&local_24,0);
    if (iVar1 == 0) {
      iVar1 = uv_listen((uv_stream_t *)&tcpServer,0x1000,on_connection);
      if (iVar1 != 0) {
        run_helper_tcp6_echo_server_cold_4();
        goto LAB_00112de2;
      }
    }
    else {
      run_helper_tcp6_echo_server_cold_3();
    }
    notify_parent_process();
    iVar1 = 0;
    uv_run(loop,UV_RUN_DEFAULT);
  }
  else {
    run_helper_tcp6_echo_server_cold_2();
LAB_00112de2:
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

HELPER_IMPL(tcp6_echo_server) {
  loop = uv_default_loop();

  if (tcp6_echo_start(TEST_PORT))
    return 1;

  notify_parent_process();
  uv_run(loop, UV_RUN_DEFAULT);
  return 0;
}